

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

void lzma_next_end(lzma_next_coder *next,lzma_allocator *allocator)

{
  lzma_allocator *__dest;
  undefined1 local_60 [8];
  undefined8 local_58;
  lzma_allocator *local_18;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  if (next->init != 0) {
    local_18 = allocator;
    allocator_local = (lzma_allocator *)next;
    if (next->end == (lzma_end_function)0x0) {
      lzma_free(next->coder,allocator);
    }
    else {
      (*next->end)(next->coder,allocator);
    }
    __dest = allocator_local;
    memset(local_60,0,0x48);
    local_58 = 0xffffffffffffffff;
    memcpy(__dest,local_60,0x48);
  }
  return;
}

Assistant:

extern void
lzma_next_end(lzma_next_coder *next, const lzma_allocator *allocator)
{
	if (next->init != (uintptr_t)(NULL)) {
		// To avoid tiny end functions that simply call
		// lzma_free(coder, allocator), we allow leaving next->end
		// NULL and call lzma_free() here.
		if (next->end != NULL)
			next->end(next->coder, allocator);
		else
			lzma_free(next->coder, allocator);

		// Reset the variables so the we don't accidentally think
		// that it is an already initialized coder.
		*next = LZMA_NEXT_CODER_INIT;
	}

	return;
}